

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O2

void Fxu_HeapSinglePrint(FILE *pFile,Fxu_HeapSingle *p)

{
  Fxu_Single *pFVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  Fxu_HeapSingleCheck(p);
  uVar4 = 1;
  fwrite("The contents of the heap:\n",0x1a,1,(FILE *)pFile);
  fprintf((FILE *)pFile,"Level %d:  ",1);
  iVar2 = 1;
  uVar3 = 1;
  while( true ) {
    p->i = iVar2;
    if ((p->nItems < iVar2) || (p->pTree[iVar2] == (Fxu_Single *)0x0)) break;
    pFVar1 = p->pTree[uVar4];
    if (uVar4 != (uint)pFVar1->HNum) {
      __assert_fail("Counter == p->pTree[Counter]->HNum",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuHeapS.c"
                    ,0x83,"void Fxu_HeapSinglePrint(FILE *, Fxu_HeapSingle *)");
    }
    fprintf((FILE *)pFile,"%2d=%3d  ",uVar4 & 0xffffffff,(ulong)(uint)pFVar1->Weight);
    uVar4 = uVar4 + 1;
    if (uVar4 == (uint)(1 << ((byte)uVar3 & 0x1f))) {
      fputc(10,(FILE *)pFile);
      uVar3 = (ulong)((int)uVar3 + 1);
      fprintf((FILE *)pFile,"Level %d:  ",uVar3);
    }
    iVar2 = p->i + 1;
  }
  fputc(10,(FILE *)pFile);
  fwrite("End of the heap printout.\n",0x1a,1,(FILE *)pFile);
  return;
}

Assistant:

void Fxu_HeapSinglePrint( FILE * pFile, Fxu_HeapSingle * p )
{
	Fxu_Single * pSingle;
	int Counter = 1;
	int Degree  = 1;

	Fxu_HeapSingleCheck( p );
	fprintf( pFile, "The contents of the heap:\n" );
	fprintf( pFile, "Level %d:  ", Degree );
	Fxu_HeapSingleForEachItem( p, pSingle )
	{
		assert( Counter == p->pTree[Counter]->HNum );
		fprintf( pFile, "%2d=%3d  ", Counter, FXU_HEAP_SINGLE_WEIGHT(p->pTree[Counter]) );
		if ( ++Counter == (1 << Degree) )
		{
			fprintf( pFile, "\n" );
			Degree++;
			fprintf( pFile, "Level %d:  ", Degree );
		}
	}
	fprintf( pFile, "\n" );
	fprintf( pFile, "End of the heap printout.\n" );
}